

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::EnsureLoopBodyAsmJsLoadSlot(IRBuilderAsmJs *this,RegSlot regSlot,IRType type)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  IRType IVar4;
  BVIndex BVar5;
  JitLoopBodyData *this_00;
  BVFixed *this_01;
  undefined4 *puVar6;
  SymOpnd *this_02;
  StackSym *this_03;
  RegOpnd *dstOpnd_00;
  Instr *instr;
  Instr *ldSlotInstr;
  RegOpnd *dstOpnd;
  StackSym *symDst;
  SymOpnd *fieldSymOpnd;
  BVFixed *ldSlotsBV;
  IRType type_local;
  RegSlot regSlot_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = GetJitLoopBodyData(this);
  this_01 = JitLoopBodyData::GetLdSlots(this_00);
  BVar5 = BVFixed::Length(this_01);
  if (BVar5 <= regSlot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xdf7,"(regSlot < ldSlotsBV->Length())","regSlot < ldSlotsBV->Length()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar3 = BVFixed::TestAndSet(this_01,regSlot);
  if (BVar3 == '\0') {
    this_02 = BuildAsmJsLoopBodySlotOpnd(this,regSlot,type);
    func = this->m_func;
    IVar4 = IR::Opnd::GetType(&this_02->super_Opnd);
    this_03 = StackSym::FindOrCreate(regSlot,regSlot,func,IVar4);
    IVar4 = StackSym::GetType(this_03);
    dstOpnd_00 = IR::RegOpnd::New(this_03,IVar4,this->m_func);
    instr = IR::Instr::New(LdSlot,&dstOpnd_00->super_Opnd,&this_02->super_Opnd,this->m_func);
    IR::Instr::InsertAfter(this->m_func->m_headInstr,instr);
    if (this->m_lastInstr == this->m_func->m_headInstr) {
      this->m_lastInstr = instr;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::EnsureLoopBodyAsmJsLoadSlot(Js::RegSlot regSlot, IRType type)
{
    BVFixed* ldSlotsBV = GetJitLoopBodyData().GetLdSlots();

    AssertOrFailFast(regSlot < ldSlotsBV->Length());
    if (ldSlotsBV->TestAndSet(regSlot))
    {
        return;
    }

    IR::SymOpnd * fieldSymOpnd = this->BuildAsmJsLoopBodySlotOpnd(regSlot, type);

    StackSym * symDst = StackSym::FindOrCreate(static_cast<SymID>(regSlot), regSlot, m_func, fieldSymOpnd->GetType());
    IR::RegOpnd * dstOpnd = IR::RegOpnd::New(symDst, symDst->GetType(), m_func);
    IR::Instr * ldSlotInstr = IR::Instr::New(Js::OpCode::LdSlot, dstOpnd, fieldSymOpnd, m_func);

    m_func->m_headInstr->InsertAfter(ldSlotInstr);
    if (m_lastInstr == m_func->m_headInstr)
    {
        m_lastInstr = ldSlotInstr;
    }
}